

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderCopyDockSpace
               (ImGuiID src_dockspace_id,ImGuiID dst_dockspace_id,
               ImVector<const_char_*> *in_window_remap_pairs)

{
  char *data_p;
  bool bVar1;
  char **ppcVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindowSettings *pIVar4;
  uint *puVar5;
  ImGuiDockNode *pIVar6;
  ImGuiWindow **ppIVar7;
  ImVector<const_char_*> *in_RDX;
  ImGuiWindow *window;
  int window_n;
  ImGuiDockNode *node;
  ImGuiID dst_dock_id_1;
  ImGuiID src_dock_id_1;
  int dock_remap_n_1;
  int dock_remap_n;
  ImGuiID dst_dock_id;
  ImGuiWindowSettings *src_window_settings;
  ImGuiWindow *src_window;
  ImGuiID src_dock_id;
  ImGuiID src_window_id;
  char *dst_window_name;
  char *src_window_name;
  int remap_window_n;
  ImVector<unsigned_int> src_windows;
  ImVector<unsigned_int> node_remap_pairs;
  uint *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  ImGuiID in_stack_ffffffffffffff04;
  ImVector<unsigned_int> *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  ImGuiDockNode *window_name;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  int local_94;
  int local_7c;
  int local_78;
  uint local_74;
  ImGuiID local_60;
  int local_44;
  ImVector<unsigned_int> local_40 [2];
  ImVector<unsigned_int> local_20;
  ImVector<const_char_*> *local_10;
  
  local_10 = in_RDX;
  ImVector<unsigned_int>::ImVector(&local_20);
  DockBuilderCopyNode((ImGuiID)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                      (ImGuiID)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ImVector<unsigned_int>::ImVector(local_40);
  local_44 = 0;
  do {
    if (*(int *)local_10 <= local_44) {
      for (local_7c = 0; local_7c < local_20.Size; local_7c = local_7c + 2) {
        puVar5 = ImVector<unsigned_int>::operator[](&local_20,local_7c);
        if (*puVar5 != 0) {
          ImVector<unsigned_int>::operator[](&local_20,local_7c + 1);
          pIVar6 = DockBuilderGetNode(in_stack_ffffffffffffff04);
          window_name = pIVar6;
          for (local_94 = 0; local_94 < (pIVar6->Windows).Size; local_94 = local_94 + 1) {
            ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&pIVar6->Windows,local_94);
            bVar1 = ImVector<unsigned_int>::contains(local_40,&(*ppIVar7)->ID);
            in_stack_ffffffffffffff04 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff04);
            if (!bVar1) {
              DockBuilderDockWindow((char *)window_name,(ImGuiID)((ulong)ppIVar7 >> 0x20));
            }
          }
        }
      }
      ImVector<unsigned_int>::~ImVector
                ((ImVector<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      ImVector<unsigned_int>::~ImVector
                ((ImVector<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      return;
    }
    ppcVar2 = ImVector<const_char_*>::operator[](local_10,local_44);
    data_p = *ppcVar2;
    ImVector<const_char_*>::operator[](local_10,local_44 + 1);
    ImHashStr(data_p,0,0);
    ImVector<unsigned_int>::push_back
              ((ImVector<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    local_60 = 0;
    pIVar3 = FindWindowByID(in_stack_ffffffffffffff04);
    if (pIVar3 == (ImGuiWindow *)0x0) {
      pIVar4 = FindWindowSettings((ImGuiID)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      if (pIVar4 != (ImGuiWindowSettings *)0x0) {
        local_60 = pIVar4->DockId;
      }
    }
    else {
      local_60 = pIVar3->DockId;
    }
    local_74 = 0;
    for (local_78 = 0; local_78 < local_20.Size; local_78 = local_78 + 2) {
      puVar5 = ImVector<unsigned_int>::operator[](&local_20,local_78);
      if (*puVar5 == local_60) {
        puVar5 = ImVector<unsigned_int>::operator[](&local_20,local_78 + 1);
        local_74 = *puVar5;
        break;
      }
    }
    if (local_74 == 0) {
      DockBuilderCopyWindowSettings(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    else {
      DockBuilderDockWindow
                (in_stack_ffffffffffffff10,(ImGuiID)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    local_44 = local_44 + 2;
  } while( true );
}

Assistant:

void ImGui::DockBuilderCopyDockSpace(ImGuiID src_dockspace_id, ImGuiID dst_dockspace_id, ImVector<const char*>* in_window_remap_pairs)
{
    IM_ASSERT(src_dockspace_id != 0);
    IM_ASSERT(dst_dockspace_id != 0);
    IM_ASSERT(in_window_remap_pairs != NULL);
    IM_ASSERT((in_window_remap_pairs->Size % 2) == 0);

    // Duplicate entire dock
    // FIXME: When overwriting dst_dockspace_id, windows that aren't part of our dockspace window class but that are docked in a same node will be split apart,
    // whereas we could attempt to at least keep them together in a new, same floating node.
    ImVector<ImGuiID> node_remap_pairs;
    DockBuilderCopyNode(src_dockspace_id, dst_dockspace_id, &node_remap_pairs);

    // Attempt to transition all the upcoming windows associated to dst_dockspace_id into the newly created hierarchy of dock nodes
    // (The windows associated to src_dockspace_id are staying in place)
    ImVector<ImGuiID> src_windows;
    for (int remap_window_n = 0; remap_window_n < in_window_remap_pairs->Size; remap_window_n += 2)
    {
        const char* src_window_name = (*in_window_remap_pairs)[remap_window_n];
        const char* dst_window_name = (*in_window_remap_pairs)[remap_window_n + 1];
        ImGuiID src_window_id = ImHashStr(src_window_name);
        src_windows.push_back(src_window_id);

        // Search in the remapping tables
        ImGuiID src_dock_id = 0;
        if (ImGuiWindow* src_window = FindWindowByID(src_window_id))
            src_dock_id = src_window->DockId;
        else if (ImGuiWindowSettings* src_window_settings = FindWindowSettings(src_window_id))
            src_dock_id = src_window_settings->DockId;
        ImGuiID dst_dock_id = 0;
        for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
            if (node_remap_pairs[dock_remap_n] == src_dock_id)
            {
                dst_dock_id = node_remap_pairs[dock_remap_n + 1];
                //node_remap_pairs[dock_remap_n] = node_remap_pairs[dock_remap_n + 1] = 0; // Clear
                break;
            }

        if (dst_dock_id != 0)
        {
            // Docked windows gets redocked into the new node hierarchy.
            IMGUI_DEBUG_LOG_DOCKING("Remap live window '%s' 0x%08X -> '%s' 0x%08X\n", src_window_name, src_dock_id, dst_window_name, dst_dock_id);
            DockBuilderDockWindow(dst_window_name, dst_dock_id);
        }
        else
        {
            // Floating windows gets their settings transferred (regardless of whether the new window already exist or not)
            // When this is leading to a Copy and not a Move, we would get two overlapping floating windows. Could we possibly dock them together?
            IMGUI_DEBUG_LOG_DOCKING("Remap window settings '%s' -> '%s'\n", src_window_name, dst_window_name);
            DockBuilderCopyWindowSettings(src_window_name, dst_window_name);
        }
    }

    // Anything else in the source nodes of 'node_remap_pairs' are windows that were docked in src_dockspace_id but are not owned by it (unaffiliated windows, e.g. "ImGui Demo")
    // Find those windows and move to them to the cloned dock node. This may be optional?
    for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
        if (ImGuiID src_dock_id = node_remap_pairs[dock_remap_n])
        {
            ImGuiID dst_dock_id = node_remap_pairs[dock_remap_n + 1];
            ImGuiDockNode* node = DockBuilderGetNode(src_dock_id);
            for (int window_n = 0; window_n < node->Windows.Size; window_n++)
            {
                ImGuiWindow* window = node->Windows[window_n];
                if (src_windows.contains(window->ID))
                    continue;

                // Docked windows gets redocked into the new node hierarchy.
                IMGUI_DEBUG_LOG_DOCKING("Remap window '%s' %08X -> %08X\n", window->Name, src_dock_id, dst_dock_id);
                DockBuilderDockWindow(window->Name, dst_dock_id);
            }
        }
}